

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::FileError::~FileError(FileError *this)

{
  FileError *this_local;
  
  ~FileError(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

static FileError Missing(std::string name) { return FileError(name + " was not readable (missing?)"); }